

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

bool si9ma::BinaryTree::is_complete_binary_tree(TreeNode *head)

{
  bool bVar1;
  reference ppTVar2;
  undefined1 local_70 [8];
  queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
  node_queue;
  value_type pTStack_18;
  bool leaf;
  TreeNode *head_local;
  
  if (head == (TreeNode *)0x0) {
    head_local._7_1_ = 1;
  }
  else {
    node_queue.c.
    super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
    pTStack_18 = head;
    std::
    queue<si9ma::TreeNode_const*,std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>>
    ::queue<std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>,void>
              ((queue<si9ma::TreeNode_const*,std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>>
                *)local_70);
    std::
    queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
    ::push((queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
            *)local_70,&stack0xffffffffffffffe8);
    while (bVar1 = std::
                   queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                   ::empty((queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                            *)local_70), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppTVar2 = std::
                queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                ::front((queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                         *)local_70);
      pTStack_18 = *ppTVar2;
      std::
      queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
      ::pop((queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
             *)local_70);
      if ((((node_queue.c.
             super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) &&
          ((pTStack_18->left != (TreeNode *)0x0 || (pTStack_18->right != (TreeNode *)0x0)))) ||
         ((pTStack_18->left == (TreeNode *)0x0 && (pTStack_18->right != (TreeNode *)0x0)))) {
        head_local._7_1_ = 0;
        goto LAB_00113bb4;
      }
      if ((pTStack_18->left == (TreeNode *)0x0) || (pTStack_18->right == (TreeNode *)0x0)) {
        node_queue.c.
        super__Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>._M_impl
        .super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
      }
      if (pTStack_18->left != (TreeNode *)0x0) {
        std::
        queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
        ::push((queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                *)local_70,&pTStack_18->left);
      }
      if (pTStack_18->right != (TreeNode *)0x0) {
        std::
        queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
        ::push((queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
                *)local_70,&pTStack_18->right);
      }
    }
    head_local._7_1_ = 1;
LAB_00113bb4:
    std::
    queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
    ::~queue((queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
              *)local_70);
  }
  return (bool)(head_local._7_1_ & 1);
}

Assistant:

bool BinaryTree::is_complete_binary_tree(const si9ma::TreeNode *head) {
        if (head == nullptr)
            return true;

        bool leaf = false;
        queue<const TreeNode *> node_queue;
        node_queue.push(head);
        while (!node_queue.empty()){
            head = node_queue.front();
            node_queue.pop();

            if ((leaf && (head->left != nullptr || head->right != nullptr))
                 || (head->left == nullptr && head->right != nullptr))
                return false;

            if (head->left == nullptr || head->right == nullptr)
                leaf = true;

            if (head->left != nullptr)
                node_queue.push(head->left);

            if (head->right != nullptr)
                node_queue.push(head->right);
        }

        return true;
    }